

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_add_or_set(ggml_context *ctx,ggml_cgraph *cgraph,size_t isrc,ggml_tensor *tensor)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  
  pgVar1 = (cgraph->visited_hash_set).keys[isrc];
  if (pgVar1 != (ggml_tensor *)0x0) {
    pgVar2 = cgraph->grads[isrc];
    if (pgVar2 == (ggml_tensor *)0x0) {
      cgraph->grads[isrc] = tensor;
    }
    else {
      pgVar2 = ggml_add_impl(ctx,pgVar2,tensor,cgraph->grad_accs[isrc] != (ggml_tensor *)0x0);
      cgraph->grads[isrc] = pgVar2;
    }
    ggml_format_name(cgraph->grads[isrc],"grad for %s",pgVar1->name);
    ggml_build_forward_expand(cgraph,cgraph->grads[isrc]);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x1473,
             "GGML_ASSERT(%s) failed","src");
}

Assistant:

static void ggml_add_or_set(
        struct ggml_context * ctx,
        struct ggml_cgraph  * cgraph,
        size_t                isrc,
        struct ggml_tensor  * tensor) {
    struct ggml_tensor * src = cgraph->visited_hash_set.keys[isrc];
    GGML_ASSERT(src);
    if (cgraph->grads[isrc]) {
        cgraph->grads[isrc] = ggml_add_impl(ctx, cgraph->grads[isrc], tensor, /*inplace =*/ cgraph->grad_accs[isrc]);
    } else {
        cgraph->grads[isrc] = tensor;
    }
    ggml_format_name(cgraph->grads[isrc], "grad for %s", src->name);
    ggml_build_forward_expand(cgraph, cgraph->grads[isrc]);
}